

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  byte bVar1;
  _Bool _Var2;
  uint idx;
  uint idx_00;
  uint idx_01;
  uint idx_02;
  CURLcode CVar3;
  connectdata *conn;
  Curl_easy *data;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  int sockindex;
  uint uVar7;
  _Bool added;
  void *old_ssl_sessionid;
  _Bool local_41;
  SSL_SESSION *local_40;
  SSL_SESSION *local_38;
  
  local_38 = ssl_sessionid;
  idx = ossl_get_ssl_data_index();
  idx_00 = ossl_get_ssl_conn_index();
  idx_01 = ossl_get_ssl_sockindex_index();
  idx_02 = ossl_get_proxy_index();
  uVar7 = 0;
  if (-1 < (int)(idx | idx_00 | idx_01 | idx_02)) {
    conn = (connectdata *)SSL_get_ex_data((SSL *)ssl,idx_00);
    data = (Curl_easy *)SSL_get_ex_data((SSL *)ssl,idx);
    pvVar4 = SSL_get_ex_data((SSL *)ssl,idx_01);
    uVar7 = 0;
    if (pvVar4 != (void *)0x0 && (data != (Curl_easy *)0x0 && conn != (connectdata *)0x0)) {
      pvVar5 = SSL_get_ex_data((SSL *)ssl,idx_02);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        bVar1 = (data->set).proxy_ssl.primary.field_0x71;
      }
      else {
        bVar1 = (data->set).ssl.primary.field_0x71;
      }
      if ((bVar1 & 8) != 0) {
        local_41 = false;
        local_40 = (SSL_SESSION *)0x0;
        Curl_ssl_sessionid_lock(data);
        sockindex = (int)((ulong)((long)pvVar4 + (-0x1e0 - (long)conn)) >> 2);
        if (pvVar5 == (void *)0x0) {
          _Var2 = Curl_ssl_getsessionid(data,conn,false,&local_40,(size_t *)0x0,sockindex);
          bVar6 = !_Var2;
        }
        else {
          bVar6 = false;
        }
        if ((bVar6) && (local_40 != local_38)) {
          bVar6 = false;
          Curl_infof(data,"old SSL session ID is stale, removing");
          Curl_ssl_delsessionid(data,local_40);
        }
        uVar7 = 0;
        if (!bVar6) {
          uVar7 = 0;
          CVar3 = Curl_ssl_addsessionid
                            (data,conn,pvVar5 != (void *)0x0,local_38,0,sockindex,&local_41);
          if (CVar3 == CURLE_OK) {
            uVar7 = (uint)local_41;
          }
          else {
            Curl_failf(data,"failed to store ssl session");
          }
        }
        Curl_ssl_sessionid_unlock(data);
      }
    }
  }
  return uVar7;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct connectdata *conn;
  struct Curl_easy *data;
  int sockindex;
  curl_socket_t *sockindex_ptr;
  int data_idx = ossl_get_ssl_data_index();
  int connectdata_idx = ossl_get_ssl_conn_index();
  int sockindex_idx = ossl_get_ssl_sockindex_index();
  int proxy_idx = ossl_get_proxy_index();
  bool isproxy;

  if(data_idx < 0 || connectdata_idx < 0 || sockindex_idx < 0 || proxy_idx < 0)
    return 0;

  conn = (struct connectdata*) SSL_get_ex_data(ssl, connectdata_idx);
  data = (struct Curl_easy *) SSL_get_ex_data(ssl, data_idx);
  /* The sockindex has been stored as a pointer to an array element */
  sockindex_ptr = (curl_socket_t*) SSL_get_ex_data(ssl, sockindex_idx);
  if(!conn || !data || !sockindex_ptr)
    return 0;

  sockindex = (int)(sockindex_ptr - conn->sock);

  isproxy = SSL_get_ex_data(ssl, proxy_idx) ? TRUE : FALSE;

  if(SSL_SET_OPTION(primary.sessionid)) {
    bool incache;
    bool added = FALSE;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(data);
    if(isproxy)
      incache = FALSE;
    else
      incache = !(Curl_ssl_getsessionid(data, conn, isproxy,
                                        &old_ssl_sessionid, NULL, sockindex));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing");
        Curl_ssl_delsessionid(data, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(data, conn, isproxy, ssl_sessionid,
                                0 /* unknown size */, sockindex, &added)) {
        if(added) {
          /* the session has been put into the session cache */
          res = 1;
        }
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(data);
  }

  return res;
}